

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fitting.hpp
# Opt level: O0

pair<eos::core::Mesh,_eos::fitting::RenderingParameters> *
eos::fitting::fit_shape_and_pose
          (pair<eos::core::Mesh,_eos::fitting::RenderingParameters> *__return_storage_ptr__,
          MorphableModel *morphable_model,LandmarkCollection<Eigen::Vector2f> *landmarks,
          LandmarkMapper *landmark_mapper,int image_width,int image_height,
          EdgeTopology *edge_topology,ContourLandmarks *contour_landmarks,
          ModelContour *model_contour,int num_iterations,optional<int> num_shape_coefficients_to_fit
          ,float lambda_identity,optional<int> num_expression_coefficients_to_fit,
          optional<float> lambda_expressions,
          vector<float,_std::allocator<float>_> *pca_shape_coefficients,
          vector<float,_std::allocator<float>_> *expression_coefficients,
          vector<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
          *fitted_image_points)

{
  pointer *ppMVar1;
  float yaw_angle_00;
  LandmarkMapper *pLVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  size_type sVar6;
  PcaModel *pPVar7;
  runtime_error *this;
  optional<std::variant<eos::morphablemodel::PcaModel,_std::vector<eos::morphablemodel::Blendshape,_std::allocator<eos::morphablemodel::Blendshape>_>_>_>
  *poVar8;
  variant<eos::morphablemodel::PcaModel,_std::vector<eos::morphablemodel::Blendshape,_std::allocator<eos::morphablemodel::Blendshape>_>_>
  *pvVar9;
  VectorXf *pVVar10;
  vector<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_> *pvVar11;
  vector<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_> *pvVar12;
  vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_> *pvVar13;
  vector<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_> *pvVar14;
  ulong uVar15;
  const_reference pvVar16;
  optional<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>_>
  *landmark_definitions;
  int *piVar17;
  MatrixBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *this_00;
  Scalar *pSVar18;
  const_iterator cVar19;
  const_iterator cVar20;
  reference piVar21;
  DenseCoeffsBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_1> *pDVar22;
  Scalar *y;
  Scalar *z;
  MatrixBase<Eigen::Matrix<float,_1,1,0,_1,1>> *this_01;
  vector<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
  *vec_b;
  RenderingParameters *rendering_parameters;
  Mesh local_a70;
  vector<float,_std::allocator<float>_> local_9e0;
  Matrix<float,__1,_1,_0,__1,_1> local_9c8;
  CwiseBinaryOp<Eigen::internal::scalar_sum_op<float,_float>,_const_Eigen::Matrix<float,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>
  local_9b8;
  _Optional_payload_base<float> local_9a0;
  MorphableModel *local_998;
  vector<float,_std::allocator<float>_> local_990;
  vector<float,_std::allocator<float>_> local_978;
  undefined1 local_960 [56];
  Matrix<float,_3,_4,_0,_3,_4> local_928;
  vector<float,_std::allocator<float>_> local_8f0;
  vector<float,_std::allocator<float>_> local_8d8;
  Matrix<float,__1,_1,_0,__1,_1> local_8c0;
  CwiseBinaryOp<Eigen::internal::scalar_sum_op<float,_float>,_const_Eigen::Matrix<float,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>
  local_8b0;
  undefined1 local_898 [8];
  VectorXf mean_plus_expressions;
  undefined1 local_838 [8];
  Matrix<float,_3,_4,_0,_3,_4> affine_from_ortho_1;
  RenderingParameters local_7d8;
  _Optional_payload_base<int> local_788;
  vector<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_std::allocator<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>
  local_780;
  vector<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
  local_768;
  ScaledOrthoProjectionParameters local_74c;
  Scalar local_71c;
  Matrix<float,_4,_1,_0,_4,_1> local_718;
  int local_704;
  iterator iStack_700;
  int v;
  iterator __end3;
  iterator __begin3;
  vector<int,_std::allocator<int>_> *__range3;
  vector<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
  local_6d0;
  undefined1 local_6b8 [8];
  pair<std::vector<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>,_std::vector<int,_std::allocator<int>_>_>
  edge_correspondences;
  undefined1 local_668 [8];
  LandmarkCollection<Eigen::Matrix<float,_2,_1>_> contour_landmarks__1;
  undefined1 local_630 [8];
  LandmarkCollection<Eigen::Matrix<float,_2,_1>_> contour_landmarks_;
  vector<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
  occluding_contour_landmarks;
  vector<int,_std::allocator<int>_> local_5e8;
  tuple<std::vector<Eigen::Matrix<float,2,1,0,2,1>,std::allocator<Eigen::Matrix<float,2,1,0,2,1>>>&,std::_Swallow_assign_const&,std::vector<int,std::allocator<int>>&>
  local_5d0 [24];
  Vector4f local_5b8;
  Matrix4f local_5a8;
  Matrix4f local_568;
  tuple<std::vector<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>,_std::vector<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_std::allocator<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>,_std::vector<int,_std::allocator<int>_>_>
  local_520;
  undefined1 local_4d8 [20];
  Scalar yaw_angle;
  vector<int,_std::allocator<int>_> vertex_indices_contour;
  vector<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
  image_points_contour;
  undefined1 local_490 [4];
  int i_1;
  vector<int,_std::allocator<int>_> fixed_vertex_indices;
  vector<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
  fixed_image_points;
  vector<float,_std::allocator<float>_> local_3d0;
  Matrix<float,__1,_1,_0,__1,_1> local_3b8;
  CwiseBinaryOp<Eigen::internal::scalar_sum_op<float,_float>,_const_Eigen::Matrix<float,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>
  local_3a8;
  _Optional_payload_base<float> local_390;
  MorphableModel *local_388;
  vector<float,_std::allocator<float>_> local_380;
  RenderingParameters local_368;
  undefined1 local_318 [8];
  Matrix<float,_3,_4,_0,_3,_4> affine_from_ortho;
  undefined1 local_2b8 [8];
  RenderingParameters rendering_params;
  optional<int> local_260;
  vector<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_std::allocator<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>
  local_258;
  vector<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
  local_240;
  undefined1 local_228 [8];
  ScaledOrthoProjectionParameters current_pose;
  string local_1f0;
  _Optional_payload_base<int> local_1cc;
  optional<int> vertex_idx;
  int i;
  vector<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
  image_points;
  vector<int,_std::allocator<int>_> vertex_indices;
  vector<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_std::allocator<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>
  model_points;
  Mesh current_mesh;
  Matrix<float,__1,_1,_0,__1,_1> local_d0;
  CwiseBinaryOp<Eigen::internal::scalar_sum_op<float,_float>,_const_Eigen::Matrix<float,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>
  local_c0;
  undefined1 local_a8 [8];
  VectorXf current_combined_shape;
  undefined1 local_80 [8];
  VectorXf current_pca_shape;
  int local_50;
  float lambda_identity_local;
  int image_height_local;
  int image_width_local;
  LandmarkMapper *landmark_mapper_local;
  LandmarkCollection<Eigen::Vector2f> *landmarks_local;
  MorphableModel *morphable_model_local;
  optional<float> lambda_expressions_local;
  optional<int> num_expression_coefficients_to_fit_local;
  optional<int> num_shape_coefficients_to_fit_local;
  
  num_expression_coefficients_to_fit_local = num_shape_coefficients_to_fit;
  lambda_expressions_local.super__Optional_base<float,_true,_true>._M_payload.
  super__Optional_payload_base<float> =
       (_Optional_base<float,_true,_true>)
       (_Optional_base<float,_true,_true>)
       num_expression_coefficients_to_fit.super__Optional_base<int,_true,_true>._M_payload.
       super__Optional_payload_base<int>;
  morphable_model_local =
       (MorphableModel *)
       lambda_expressions.super__Optional_base<float,_true,_true>._M_payload.
       super__Optional_payload_base<float>;
  local_50 = image_height;
  lambda_identity_local = (float)image_width;
  _image_height_local = landmark_mapper;
  landmark_mapper_local = (LandmarkMapper *)landmarks;
  landmarks_local = (LandmarkCollection<Eigen::Vector2f> *)morphable_model;
  sVar6 = std::
          vector<eos::core::Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>,_std::allocator<eos::core::Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>_>
          ::size(landmarks);
  if (sVar6 < 4) {
    __assert_fail("landmarks.size() >= 4",
                  "/workspace/llm4binary/github/license_c_cmakelists/patrikhuber[P]eos/include/eos/fitting/fitting.hpp"
                  ,0x104,
                  "std::pair<core::Mesh, fitting::RenderingParameters> eos::fitting::fit_shape_and_pose(const morphablemodel::MorphableModel &, const core::LandmarkCollection<Eigen::Vector2f> &, const core::LandmarkMapper &, int, int, const morphablemodel::EdgeTopology &, const fitting::ContourLandmarks &, const fitting::ModelContour &, int, cpp17::optional<int>, float, cpp17::optional<int>, cpp17::optional<float>, std::vector<float> &, std::vector<float> &, std::vector<Eigen::Vector2f> &)"
                 );
  }
  if ((int)lambda_identity_local < 1 || local_50 < 1) {
    __assert_fail("image_width > 0 && image_height > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/patrikhuber[P]eos/include/eos/fitting/fitting.hpp"
                  ,0x105,
                  "std::pair<core::Mesh, fitting::RenderingParameters> eos::fitting::fit_shape_and_pose(const morphablemodel::MorphableModel &, const core::LandmarkCollection<Eigen::Vector2f> &, const core::LandmarkMapper &, int, int, const morphablemodel::EdgeTopology &, const fitting::ContourLandmarks &, const fitting::ModelContour &, int, cpp17::optional<int>, float, cpp17::optional<int>, cpp17::optional<float>, std::vector<float> &, std::vector<float> &, std::vector<Eigen::Vector2f> &)"
                 );
  }
  if (num_iterations < 1) {
    __assert_fail("num_iterations > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/patrikhuber[P]eos/include/eos/fitting/fitting.hpp"
                  ,0x106,
                  "std::pair<core::Mesh, fitting::RenderingParameters> eos::fitting::fit_shape_and_pose(const morphablemodel::MorphableModel &, const core::LandmarkCollection<Eigen::Vector2f> &, const core::LandmarkMapper &, int, int, const morphablemodel::EdgeTopology &, const fitting::ContourLandmarks &, const fitting::ModelContour &, int, cpp17::optional<int>, float, cpp17::optional<int>, cpp17::optional<float>, std::vector<float> &, std::vector<float> &, std::vector<Eigen::Vector2f> &)"
                 );
  }
  sVar6 = std::vector<float,_std::allocator<float>_>::size(pca_shape_coefficients);
  pPVar7 = morphablemodel::MorphableModel::get_shape_model((MorphableModel *)landmarks_local);
  iVar4 = morphablemodel::PcaModel::get_num_principal_components(pPVar7);
  if (sVar6 <= (ulong)(long)iVar4) {
    bVar3 = std::optional::operator_cast_to_bool
                      ((optional *)&num_expression_coefficients_to_fit_local);
    if (bVar3) {
      piVar17 = std::optional<int>::value(&num_expression_coefficients_to_fit_local);
      iVar4 = *piVar17;
      pPVar7 = morphablemodel::MorphableModel::get_shape_model((MorphableModel *)landmarks_local);
      iVar5 = morphablemodel::PcaModel::get_num_principal_components(pPVar7);
      if (iVar5 < iVar4) {
        this = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error
                  (this,
                   "Specified more shape coefficients to fit than the given shape model contains.");
        __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
    }
    bVar3 = std::optional::operator_cast_to_bool
                      ((optional *)&num_expression_coefficients_to_fit_local);
    if (!bVar3) {
      pPVar7 = morphablemodel::MorphableModel::get_shape_model((MorphableModel *)landmarks_local);
      current_pca_shape.super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.m_storage.
      m_rows._0_4_ = morphablemodel::PcaModel::get_num_principal_components(pPVar7);
      std::optional<int>::optional<int,_true>
                ((optional<int> *)
                 ((long)&current_pca_shape.
                         super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.m_storage.
                         m_rows + 4),
                 (int *)&current_pca_shape.
                         super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.m_storage.
                         m_rows);
      num_expression_coefficients_to_fit_local.super__Optional_base<int,_true,_true>._M_payload.
      super__Optional_payload_base<int> =
           (_Optional_base<int,_true,_true>)(_Optional_base<int,_true,_true>)stack0xffffffffffffff94
      ;
    }
    bVar3 = std::vector<float,_std::allocator<float>_>::empty(pca_shape_coefficients);
    if (bVar3) {
      piVar17 = std::optional<int>::value(&num_expression_coefficients_to_fit_local);
      std::vector<float,_std::allocator<float>_>::resize(pca_shape_coefficients,(long)*piVar17);
    }
    pPVar7 = morphablemodel::MorphableModel::get_shape_model((MorphableModel *)landmarks_local);
    std::vector<float,_std::allocator<float>_>::vector
              ((vector<float,_std::allocator<float>_> *)
               &current_combined_shape.super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>
                .m_storage.m_rows,pca_shape_coefficients);
    morphablemodel::PcaModel::draw_sample
              ((PcaModel *)local_80,(vector<float,_std::allocator<float>_> *)pPVar7);
    std::vector<float,_std::allocator<float>_>::~vector
              ((vector<float,_std::allocator<float>_> *)
               &current_combined_shape.super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>
                .m_storage.m_rows);
    bVar3 = morphablemodel::MorphableModel::has_separate_expression_model
                      ((MorphableModel *)landmarks_local);
    if (!bVar3) {
      __assert_fail("morphable_model.has_separate_expression_model()",
                    "/workspace/llm4binary/github/license_c_cmakelists/patrikhuber[P]eos/include/eos/fitting/fitting.hpp"
                    ,300,
                    "std::pair<core::Mesh, fitting::RenderingParameters> eos::fitting::fit_shape_and_pose(const morphablemodel::MorphableModel &, const core::LandmarkCollection<Eigen::Vector2f> &, const core::LandmarkMapper &, int, int, const morphablemodel::EdgeTopology &, const fitting::ContourLandmarks &, const fitting::ModelContour &, int, cpp17::optional<int>, float, cpp17::optional<int>, cpp17::optional<float>, std::vector<float> &, std::vector<float> &, std::vector<Eigen::Vector2f> &)"
                   );
    }
    poVar8 = morphablemodel::MorphableModel::get_expression_model((MorphableModel *)landmarks_local)
    ;
    pvVar9 = std::
             optional<std::variant<eos::morphablemodel::PcaModel,_std::vector<eos::morphablemodel::Blendshape,_std::allocator<eos::morphablemodel::Blendshape>_>_>_>
             ::value(poVar8);
    std::vector<float,_std::allocator<float>_>::vector
              ((vector<float,_std::allocator<float>_> *)
               &current_mesh.tti.
                super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage,expression_coefficients);
    morphablemodel::draw_sample
              ((morphablemodel *)&local_d0,pvVar9,
               (vector<float,_std::allocator<float>_> *)
               &current_mesh.tti.
                super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage);
    Eigen::MatrixBase<Eigen::Matrix<float,-1,1,0,-1,1>>::operator+
              (&local_c0,(MatrixBase<Eigen::Matrix<float,_1,1,0,_1,1>> *)local_80,
               (MatrixBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_> *)&local_d0);
    Eigen::Matrix<float,-1,1,0,-1,1>::
    Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<float,float>,Eigen::Matrix<float,_1,1,0,_1,1>const,Eigen::Matrix<float,_1,1,0,_1,1>const>>
              ((Matrix<float,_1,1,0,_1,1> *)local_a8,
               (EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<float,_float>,_const_Eigen::Matrix<float,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>_>
                *)&local_c0);
    Eigen::Matrix<float,_-1,_1,_0,_-1,_1>::~Matrix(&local_d0);
    std::vector<float,_std::allocator<float>_>::~vector
              ((vector<float,_std::allocator<float>_> *)
               &current_mesh.tti.
                super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage);
    pPVar7 = morphablemodel::MorphableModel::get_color_model((MorphableModel *)landmarks_local);
    pVVar10 = morphablemodel::PcaModel::get_mean(pPVar7);
    pPVar7 = morphablemodel::MorphableModel::get_shape_model((MorphableModel *)landmarks_local);
    pvVar11 = morphablemodel::PcaModel::get_triangle_list(pPVar7);
    pPVar7 = morphablemodel::MorphableModel::get_color_model((MorphableModel *)landmarks_local);
    pvVar12 = morphablemodel::PcaModel::get_triangle_list(pPVar7);
    pvVar13 = morphablemodel::MorphableModel::get_texture_coordinates
                        ((MorphableModel *)landmarks_local);
    pvVar14 = morphablemodel::MorphableModel::get_texture_triangle_indices
                        ((MorphableModel *)landmarks_local);
    morphablemodel::sample_to_mesh
              ((Mesh *)&model_points.
                        super__Vector_base<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_std::allocator<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage,(VectorXf *)local_a8,
               pVVar10,pvVar11,pvVar12,pvVar13,pvVar14);
    std::
    vector<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_std::allocator<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>
    ::vector((vector<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_std::allocator<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>
              *)&vertex_indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage);
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)
               &image_points.
                super__Vector_base<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::
    vector<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
    ::vector((vector<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
              *)&vertex_idx.super__Optional_base<int,_true,_true>._M_payload.
                 super__Optional_payload_base<int>._M_engaged);
    for (vertex_idx.super__Optional_base<int,_true,_true>._M_payload.
         super__Optional_payload_base<int>._M_payload._M_value = 0;
        uVar15 = (ulong)vertex_idx.super__Optional_base<int,_true,_true>._M_payload.
                        super__Optional_payload_base<int>._M_payload._M_value,
        sVar6 = std::
                vector<eos::core::Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>,_std::allocator<eos::core::Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>_>
                ::size((vector<eos::core::Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>,_std::allocator<eos::core::Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>_>
                        *)landmark_mapper_local), uVar15 < sVar6;
        vertex_idx.super__Optional_base<int,_true,_true>._M_payload.
        super__Optional_payload_base<int>._M_payload._M_value =
             vertex_idx.super__Optional_base<int,_true,_true>._M_payload.
             super__Optional_payload_base<int>._M_payload._M_value + 1) {
      pvVar16 = std::
                vector<eos::core::Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>,_std::allocator<eos::core::Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>_>
                ::operator[]((vector<eos::core::Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>,_std::allocator<eos::core::Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>_>
                              *)landmark_mapper_local,
                             (long)vertex_idx.super__Optional_base<int,_true,_true>._M_payload.
                                   super__Optional_payload_base<int>._M_payload._M_value);
      std::__cxx11::string::string((string *)&local_1f0,(string *)pvVar16);
      pLVar2 = _image_height_local;
      landmark_definitions =
           morphablemodel::MorphableModel::get_landmark_definitions_abi_cxx11_
                     ((MorphableModel *)landmarks_local);
      local_1cc = (_Optional_payload_base<int>)
                  core::get_vertex_index(&local_1f0,pLVar2,landmark_definitions);
      std::__cxx11::string::~string((string *)&local_1f0);
      bVar3 = std::optional::operator_cast_to_bool((optional *)&local_1cc);
      if (bVar3) {
        piVar17 = std::optional<int>::value((optional<int> *)&local_1cc);
        this_00 = (MatrixBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *)
                  std::
                  vector<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
                  ::operator[]((vector<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
                                *)&model_points.
                                   super__Vector_base<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_std::allocator<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage,(long)*piVar17
                              );
        current_pose._40_8_ =
             Eigen::MatrixBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>::homogeneous(this_00);
        std::vector<Eigen::Matrix<float,4,1,0,4,1>,std::allocator<Eigen::Matrix<float,4,1,0,4,1>>>::
        emplace_back<Eigen::Homogeneous<Eigen::Matrix<float,3,1,0,3,1>,0>>
                  ((vector<Eigen::Matrix<float,4,1,0,4,1>,std::allocator<Eigen::Matrix<float,4,1,0,4,1>>>
                    *)&vertex_indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage,
                   (Homogeneous<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_0> *)&current_pose.ty);
        piVar17 = std::optional<int>::value((optional<int> *)&local_1cc);
        std::vector<int,std::allocator<int>>::emplace_back<int_const&>
                  ((vector<int,std::allocator<int>> *)
                   &image_points.
                    super__Vector_base<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,piVar17);
        pvVar16 = std::
                  vector<eos::core::Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>,_std::allocator<eos::core::Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>_>
                  ::operator[]((vector<eos::core::Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>,_std::allocator<eos::core::Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>_>
                                *)landmark_mapper_local,
                               (long)vertex_idx.super__Optional_base<int,_true,_true>._M_payload.
                                     super__Optional_payload_base<int>._M_payload._M_value);
        std::vector<Eigen::Matrix<float,2,1,0,2,1>,std::allocator<Eigen::Matrix<float,2,1,0,2,1>>>::
        emplace_back<Eigen::Matrix<float,2,1,0,2,1>const&>
                  ((vector<Eigen::Matrix<float,2,1,0,2,1>,std::allocator<Eigen::Matrix<float,2,1,0,2,1>>>
                    *)&vertex_idx.super__Optional_base<int,_true,_true>._M_payload.
                       super__Optional_payload_base<int>._M_engaged,&pvVar16->coordinates);
      }
    }
    std::
    vector<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
    ::vector(&local_240,
             (vector<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
              *)&vertex_idx.super__Optional_base<int,_true,_true>._M_payload.
                 super__Optional_payload_base<int>._M_engaged);
    std::
    vector<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_std::allocator<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>
    ::vector(&local_258,
             (vector<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_std::allocator<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>
              *)&vertex_indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage);
    std::optional<int>::optional<int_&,_true>(&local_260,&stack0xffffffffffffffb0);
    estimate_orthographic_projection_linear
              ((ScaledOrthoProjectionParameters *)local_228,&local_240,&local_258,true,local_260);
    std::
    vector<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_std::allocator<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>
    ::~vector(&local_258);
    std::
    vector<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
    ::~vector(&local_240);
    ScaledOrthoProjectionParameters::ScaledOrthoProjectionParameters
              ((ScaledOrthoProjectionParameters *)
               (affine_from_ortho.super_PlainObjectBase<Eigen::Matrix<float,_3,_4,_0,_3,_4>_>.
                m_storage.m_data.array + 10),(ScaledOrthoProjectionParameters *)local_228);
    RenderingParameters::RenderingParameters
              ((RenderingParameters *)local_2b8,
               (ScaledOrthoProjectionParameters *)
               (affine_from_ortho.super_PlainObjectBase<Eigen::Matrix<float,_3,_4,_0,_3,_4>_>.
                m_storage.m_data.array + 10),(int)lambda_identity_local,local_50);
    RenderingParameters::RenderingParameters(&local_368,(RenderingParameters *)local_2b8);
    get_3x4_affine_camera_matrix
              ((Matrix<float,_3,_4,_0,_3,_4> *)local_318,&local_368,(int)lambda_identity_local,
               local_50);
    poVar8 = morphablemodel::MorphableModel::get_expression_model((MorphableModel *)landmarks_local)
    ;
    pvVar9 = std::
             optional<std::variant<eos::morphablemodel::PcaModel,_std::vector<eos::morphablemodel::Blendshape,_std::allocator<eos::morphablemodel::Blendshape>_>_>_>
             ::value(poVar8);
    local_388 = morphable_model_local;
    local_390 = (_Optional_payload_base<float>)
                lambda_expressions_local.super__Optional_base<float,_true,_true>._M_payload.
                super__Optional_payload_base<float>;
    fit_expressions(&local_380,pvVar9,(VectorXf *)local_80,(Matrix<float,_3,_4,_0,_3,_4> *)local_318
                    ,(vector<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
                      *)&vertex_idx.super__Optional_base<int,_true,_true>._M_payload.
                         super__Optional_payload_base<int>._M_engaged,
                    (vector<int,_std::allocator<int>_> *)
                    &image_points.
                     super__Vector_base<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage,
                    (optional<float>)morphable_model_local,
                    (optional<int>)
                    lambda_expressions_local.super__Optional_base<float,_true,_true>._M_payload.
                    super__Optional_payload_base<float>);
    std::vector<float,_std::allocator<float>_>::operator=(expression_coefficients,&local_380);
    std::vector<float,_std::allocator<float>_>::~vector(&local_380);
    poVar8 = morphablemodel::MorphableModel::get_expression_model((MorphableModel *)landmarks_local)
    ;
    pvVar9 = std::
             optional<std::variant<eos::morphablemodel::PcaModel,_std::vector<eos::morphablemodel::Blendshape,_std::allocator<eos::morphablemodel::Blendshape>_>_>_>
             ::value(poVar8);
    std::vector<float,_std::allocator<float>_>::vector(&local_3d0,expression_coefficients);
    morphablemodel::draw_sample((morphablemodel *)&local_3b8,pvVar9,&local_3d0);
    Eigen::MatrixBase<Eigen::Matrix<float,-1,1,0,-1,1>>::operator+
              (&local_3a8,(MatrixBase<Eigen::Matrix<float,_1,1,0,_1,1>> *)local_80,
               (MatrixBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_> *)&local_3b8);
    Eigen::Matrix<float,-1,1,0,-1,1>::operator=
              ((Matrix<float,_1,1,0,_1,1> *)local_a8,
               (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<float,_float>,_const_Eigen::Matrix<float,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>_>
                *)&local_3a8);
    Eigen::Matrix<float,_-1,_1,_0,_-1,_1>::~Matrix(&local_3b8);
    std::vector<float,_std::allocator<float>_>::~vector(&local_3d0);
    pPVar7 = morphablemodel::MorphableModel::get_color_model((MorphableModel *)landmarks_local);
    pVVar10 = morphablemodel::PcaModel::get_mean(pPVar7);
    pPVar7 = morphablemodel::MorphableModel::get_shape_model((MorphableModel *)landmarks_local);
    pvVar11 = morphablemodel::PcaModel::get_triangle_list(pPVar7);
    pPVar7 = morphablemodel::MorphableModel::get_color_model((MorphableModel *)landmarks_local);
    pvVar12 = morphablemodel::PcaModel::get_triangle_list(pPVar7);
    pvVar13 = morphablemodel::MorphableModel::get_texture_coordinates
                        ((MorphableModel *)landmarks_local);
    pvVar14 = morphablemodel::MorphableModel::get_texture_triangle_indices
                        ((MorphableModel *)landmarks_local);
    morphablemodel::sample_to_mesh
              ((Mesh *)&fixed_image_points.
                        super__Vector_base<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage,(VectorXf *)local_a8,
               pVVar10,pvVar11,pvVar12,pvVar13,pvVar14);
    ppMVar1 = &fixed_image_points.
               super__Vector_base<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
    core::Mesh::operator=
              ((Mesh *)&model_points.
                        super__Vector_base<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_std::allocator<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage,(Mesh *)ppMVar1);
    core::Mesh::~Mesh((Mesh *)ppMVar1);
    std::
    vector<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
    ::vector((vector<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
              *)&fixed_vertex_indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage,
             (vector<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
              *)&vertex_idx.super__Optional_base<int,_true,_true>._M_payload.
                 super__Optional_payload_base<int>._M_engaged);
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)local_490,
               (vector<int,_std::allocator<int>_> *)
               &image_points.
                super__Vector_base<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    for (image_points_contour.
         super__Vector_base<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
        image_points_contour.
        super__Vector_base<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ < num_iterations;
        image_points_contour.
        super__Vector_base<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ =
             image_points_contour.
             super__Vector_base<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ + 1) {
      std::
      vector<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
      ::operator=((vector<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
                   *)&vertex_idx.super__Optional_base<int,_true,_true>._M_payload.
                      super__Optional_payload_base<int>._M_engaged,
                  (vector<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
                   *)&fixed_vertex_indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage);
      std::vector<int,_std::allocator<int>_>::operator=
                ((vector<int,_std::allocator<int>_> *)
                 &image_points.
                  super__Vector_base<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,
                 (vector<int,_std::allocator<int>_> *)local_490);
      std::
      vector<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
      ::vector((vector<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
                *)&vertex_indices_contour.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage);
      std::vector<int,_std::allocator<int>_>::vector
                ((vector<int,_std::allocator<int>_> *)(local_4d8 + 0x10));
      RenderingParameters::get_yaw_pitch_roll((RenderingParameters *)local_4d8);
      pSVar18 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_1>::operator[]
                          ((DenseCoeffsBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_1> *)local_4d8,0);
      pLVar2 = landmark_mapper_local;
      yaw_angle_00 = *pSVar18;
      local_4d8._12_4_ = yaw_angle_00;
      RenderingParameters::get_modelview(&local_568,(RenderingParameters *)local_2b8);
      RenderingParameters::get_projection(&local_5a8,(RenderingParameters *)local_2b8);
      get_opencv_viewport((fitting *)&local_5b8,(int)lambda_identity_local,local_50);
      get_contour_correspondences
                (&local_520,(LandmarkCollection<Eigen::Vector2f> *)pLVar2,contour_landmarks,
                 model_contour,yaw_angle_00,
                 (Mesh *)&model_points.
                          super__Vector_base<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_std::allocator<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_568,&local_5a8,
                 &local_5b8,7.5);
      vec_b = (vector<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
               *)(local_4d8 + 0x10);
      std::
      tie<std::vector<Eigen::Matrix<float,2,1,0,2,1>,std::allocator<Eigen::Matrix<float,2,1,0,2,1>>>,std::_Swallow_assign_const,std::vector<int,std::allocator<int>>>
                ((tuple<std::vector<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>_&,_const_std::_Swallow_assign_&,_std::vector<int,_std::allocator<int>_>_&>
                  *)local_5d0,
                 (vector<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
                  *)&vertex_indices_contour.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage,(_Swallow_assign *)&std::ignore,
                 (vector<int,_std::allocator<int>_> *)vec_b);
      std::
      tuple<std::vector<Eigen::Matrix<float,2,1,0,2,1>,std::allocator<Eigen::Matrix<float,2,1,0,2,1>>>&,std::_Swallow_assign_const&,std::vector<int,std::allocator<int>>&>
      ::operator=(local_5d0,&local_520);
      std::
      tuple<std::vector<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>,_std::vector<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_std::allocator<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>,_std::vector<int,_std::allocator<int>_>_>
      ::~tuple(&local_520);
      concat<int>(&local_5e8,
                  (vector<int,_std::allocator<int>_> *)
                  &image_points.
                   super__Vector_base<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage,
                  (vector<int,_std::allocator<int>_> *)(local_4d8 + 0x10));
      std::vector<int,_std::allocator<int>_>::operator=
                ((vector<int,_std::allocator<int>_> *)
                 &image_points.
                  super__Vector_base<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_5e8);
      std::vector<int,_std::allocator<int>_>::~vector(&local_5e8);
      concat<Eigen::Matrix<float,2,1,0,2,1>>
                ((vector<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
                  *)&occluding_contour_landmarks.
                     super__Vector_base<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage,
                 (fitting *)
                 &vertex_idx.super__Optional_base<int,_true,_true>._M_payload.
                  super__Optional_payload_base<int>._M_engaged,
                 (vector<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
                  *)&vertex_indices_contour.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage,vec_b);
      std::
      vector<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
      ::operator=((vector<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
                   *)&vertex_idx.super__Optional_base<int,_true,_true>._M_payload.
                      super__Optional_payload_base<int>._M_engaged,
                  (vector<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
                   *)&occluding_contour_landmarks.
                      super__Vector_base<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
      std::
      vector<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
      ::~vector((vector<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
                 *)&occluding_contour_landmarks.
                    super__Vector_base<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
      std::
      vector<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
      ::vector((vector<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
                *)&contour_landmarks_.
                   super__Vector_base<eos::core::Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>,_std::allocator<eos::core::Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage);
      if ((float)local_4d8._12_4_ < 0.0) {
        core::filter<Eigen::Matrix<float,2,1,0,2,1>>
                  ((LandmarkCollection<Eigen::Matrix<float,_2,_1>_> *)local_668,
                   (core *)landmark_mapper_local,
                   (LandmarkCollection<Eigen::Matrix<float,_2,_1>_> *)contour_landmarks,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)vec_b);
        cVar19 = std::
                 begin<std::vector<eos::core::Landmark<Eigen::Matrix<float,2,1,0,2,1>>,std::allocator<eos::core::Landmark<Eigen::Matrix<float,2,1,0,2,1>>>>>
                           ((vector<eos::core::Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>,_std::allocator<eos::core::Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>_>
                             *)local_668);
        cVar20 = std::
                 end<std::vector<eos::core::Landmark<Eigen::Matrix<float,2,1,0,2,1>>,std::allocator<eos::core::Landmark<Eigen::Matrix<float,2,1,0,2,1>>>>>
                           ((vector<eos::core::Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>,_std::allocator<eos::core::Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>_>
                             *)local_668);
        edge_correspondences.second.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage =
             (pointer)std::
                      for_each<__gnu_cxx::__normal_iterator<eos::core::Landmark<Eigen::Matrix<float,2,1,0,2,1>>const*,std::vector<eos::core::Landmark<Eigen::Matrix<float,2,1,0,2,1>>,std::allocator<eos::core::Landmark<Eigen::Matrix<float,2,1,0,2,1>>>>>,eos::fitting::fit_shape_and_pose(eos::morphablemodel::MorphableModel_const&,std::vector<eos::core::Landmark<Eigen::Matrix<float,2,1,0,2,1>>,std::allocator<eos::core::Landmark<Eigen::Matrix<float,2,1,0,2,1>>>>const&,eos::core::LandmarkMapper_const&,int,int,eos::morphablemodel::EdgeTopology_const&,eos::fitting::ContourLandmarks_const&,eos::fitting::ModelContour_const&,int,std::optional<int>,float,std::optional<int>,std::optional<float>,std::vector<float,std::allocator<float>>&,std::vector<float,std::allocator<float>>&,std::vector<Eigen::Matrix<float,2,1,0,2,1>,std::allocator<Eigen::Matrix<float,2,1,0,2,1>>>&)::_lambda(auto:1_const&)_2_>
                                ((__normal_iterator<const_eos::core::Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_*,_std::vector<eos::core::Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>,_std::allocator<eos::core::Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>_>_>
                                  )cVar19._M_current,
                                 (__normal_iterator<const_eos::core::Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_*,_std::vector<eos::core::Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>,_std::allocator<eos::core::Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>_>_>
                                  )cVar20._M_current,
                                 (anon_class_8_1_b8c5854d)
                                 &contour_landmarks_.
                                  super__Vector_base<eos::core::Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>,_std::allocator<eos::core::Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
        std::
        vector<eos::core::Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>,_std::allocator<eos::core::Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>_>
        ::~vector((vector<eos::core::Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>,_std::allocator<eos::core::Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>_>
                   *)local_668);
      }
      else {
        core::filter<Eigen::Matrix<float,2,1,0,2,1>>
                  ((LandmarkCollection<Eigen::Matrix<float,_2,_1>_> *)local_630,
                   (core *)landmark_mapper_local,
                   (LandmarkCollection<Eigen::Matrix<float,_2,_1>_> *)
                   &contour_landmarks->left_contour,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)vec_b);
        cVar19 = std::
                 begin<std::vector<eos::core::Landmark<Eigen::Matrix<float,2,1,0,2,1>>,std::allocator<eos::core::Landmark<Eigen::Matrix<float,2,1,0,2,1>>>>>
                           ((vector<eos::core::Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>,_std::allocator<eos::core::Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>_>
                             *)local_630);
        cVar20 = std::
                 end<std::vector<eos::core::Landmark<Eigen::Matrix<float,2,1,0,2,1>>,std::allocator<eos::core::Landmark<Eigen::Matrix<float,2,1,0,2,1>>>>>
                           ((vector<eos::core::Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>,_std::allocator<eos::core::Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>_>
                             *)local_630);
        contour_landmarks__1.
        super__Vector_base<eos::core::Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>,_std::allocator<eos::core::Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage =
             (pointer)std::
                      for_each<__gnu_cxx::__normal_iterator<eos::core::Landmark<Eigen::Matrix<float,2,1,0,2,1>>const*,std::vector<eos::core::Landmark<Eigen::Matrix<float,2,1,0,2,1>>,std::allocator<eos::core::Landmark<Eigen::Matrix<float,2,1,0,2,1>>>>>,eos::fitting::fit_shape_and_pose(eos::morphablemodel::MorphableModel_const&,std::vector<eos::core::Landmark<Eigen::Matrix<float,2,1,0,2,1>>,std::allocator<eos::core::Landmark<Eigen::Matrix<float,2,1,0,2,1>>>>const&,eos::core::LandmarkMapper_const&,int,int,eos::morphablemodel::EdgeTopology_const&,eos::fitting::ContourLandmarks_const&,eos::fitting::ModelContour_const&,int,std::optional<int>,float,std::optional<int>,std::optional<float>,std::vector<float,std::allocator<float>>&,std::vector<float,std::allocator<float>>&,std::vector<Eigen::Matrix<float,2,1,0,2,1>,std::allocator<Eigen::Matrix<float,2,1,0,2,1>>>&)::_lambda(auto:1_const&)_1_>
                                ((__normal_iterator<const_eos::core::Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_*,_std::vector<eos::core::Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>,_std::allocator<eos::core::Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>_>_>
                                  )cVar19._M_current,
                                 (__normal_iterator<const_eos::core::Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_*,_std::vector<eos::core::Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>,_std::allocator<eos::core::Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>_>_>
                                  )cVar20._M_current,
                                 (anon_class_8_1_b8c5854d)
                                 &contour_landmarks_.
                                  super__Vector_base<eos::core::Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>,_std::allocator<eos::core::Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
        std::
        vector<eos::core::Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>,_std::allocator<eos::core::Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>_>
        ::~vector((vector<eos::core::Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>,_std::allocator<eos::core::Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>_>
                   *)local_630);
      }
      rendering_parameters = (RenderingParameters *)local_2b8;
      find_occluding_edge_correspondences
                ((pair<std::vector<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>,_std::vector<int,_std::allocator<int>_>_>
                  *)local_6b8,
                 (Mesh *)&model_points.
                          super__Vector_base<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_std::allocator<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage,edge_topology,
                 rendering_parameters,
                 (vector<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
                  *)&contour_landmarks_.
                     super__Vector_base<eos::core::Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>,_std::allocator<eos::core::Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage,180.0,true);
      concat<Eigen::Matrix<float,2,1,0,2,1>>
                (&local_6d0,
                 (fitting *)
                 &vertex_idx.super__Optional_base<int,_true,_true>._M_payload.
                  super__Optional_payload_base<int>._M_engaged,
                 (vector<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
                  *)local_6b8,
                 (vector<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
                  *)rendering_parameters);
      std::
      vector<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
      ::operator=((vector<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
                   *)&vertex_idx.super__Optional_base<int,_true,_true>._M_payload.
                      super__Optional_payload_base<int>._M_engaged,&local_6d0);
      std::
      vector<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
      ::~vector(&local_6d0);
      concat<int>((vector<int,_std::allocator<int>_> *)&__range3,
                  (vector<int,_std::allocator<int>_> *)
                  &image_points.
                   super__Vector_base<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage,
                  (vector<int,_std::allocator<int>_> *)
                  &edge_correspondences.first.
                   super__Vector_base<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage);
      std::vector<int,_std::allocator<int>_>::operator=
                ((vector<int,_std::allocator<int>_> *)
                 &image_points.
                  super__Vector_base<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,
                 (vector<int,_std::allocator<int>_> *)&__range3);
      std::vector<int,_std::allocator<int>_>::~vector
                ((vector<int,_std::allocator<int>_> *)&__range3);
      std::
      vector<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_std::allocator<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>
      ::clear((vector<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_std::allocator<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>
               *)&vertex_indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
      ppMVar1 = &image_points.
                 super__Vector_base<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
      __end3 = std::vector<int,_std::allocator<int>_>::begin
                         ((vector<int,_std::allocator<int>_> *)ppMVar1);
      iStack_700 = std::vector<int,_std::allocator<int>_>::end
                             ((vector<int,_std::allocator<int>_> *)ppMVar1);
      while (bVar3 = __gnu_cxx::operator!=(&__end3,&stack0xfffffffffffff900), bVar3) {
        piVar21 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                  operator*(&__end3);
        local_704 = *piVar21;
        pDVar22 = (DenseCoeffsBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_1> *)
                  std::
                  vector<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
                  ::operator[]((vector<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
                                *)&model_points.
                                   super__Vector_base<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_std::allocator<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage,
                               (long)local_704);
        pSVar18 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_1>::operator[]
                            (pDVar22,0);
        pDVar22 = (DenseCoeffsBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_1> *)
                  std::
                  vector<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
                  ::operator[]((vector<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
                                *)&model_points.
                                   super__Vector_base<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_std::allocator<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage,
                               (long)local_704);
        y = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_1>::operator[](pDVar22,1);
        pDVar22 = (DenseCoeffsBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_1> *)
                  std::
                  vector<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
                  ::operator[]((vector<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
                                *)&model_points.
                                   super__Vector_base<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_std::allocator<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage,
                               (long)local_704);
        z = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_1>::operator[](pDVar22,2);
        local_71c = 1.0;
        Eigen::Matrix<float,_4,_1,_0,_4,_1>::Matrix(&local_718,pSVar18,y,z,&local_71c);
        std::
        vector<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_std::allocator<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>
        ::push_back((vector<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_std::allocator<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>
                     *)&vertex_indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage,&local_718);
        __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                  (&__end3);
      }
      std::
      vector<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
      ::vector(&local_768,
               (vector<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
                *)&vertex_idx.super__Optional_base<int,_true,_true>._M_payload.
                   super__Optional_payload_base<int>._M_engaged);
      std::
      vector<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_std::allocator<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>
      ::vector(&local_780,
               (vector<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_std::allocator<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>
                *)&vertex_indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage);
      std::optional<int>::optional<int_&,_true>
                ((optional<int> *)&local_788,&stack0xffffffffffffffb0);
      estimate_orthographic_projection_linear
                (&local_74c,&local_768,&local_780,true,(optional<int>)local_788);
      ScaledOrthoProjectionParameters::operator=
                ((ScaledOrthoProjectionParameters *)local_228,&local_74c);
      std::
      vector<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_std::allocator<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>
      ::~vector(&local_780);
      std::
      vector<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
      ::~vector(&local_768);
      ScaledOrthoProjectionParameters::ScaledOrthoProjectionParameters
                ((ScaledOrthoProjectionParameters *)
                 (affine_from_ortho_1.super_PlainObjectBase<Eigen::Matrix<float,_3,_4,_0,_3,_4>_>.
                  m_storage.m_data.array + 10),(ScaledOrthoProjectionParameters *)local_228);
      RenderingParameters::RenderingParameters
                (&local_7d8,
                 (ScaledOrthoProjectionParameters *)
                 (affine_from_ortho_1.super_PlainObjectBase<Eigen::Matrix<float,_3,_4,_0,_3,_4>_>.
                  m_storage.m_data.array + 10),(int)lambda_identity_local,local_50);
      RenderingParameters::operator=((RenderingParameters *)local_2b8,&local_7d8);
      RenderingParameters::RenderingParameters
                ((RenderingParameters *)
                 &mean_plus_expressions.
                  super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.m_storage.m_rows,
                 (RenderingParameters *)local_2b8);
      get_3x4_affine_camera_matrix
                ((Matrix<float,_3,_4,_0,_3,_4> *)local_838,
                 (RenderingParameters *)
                 &mean_plus_expressions.
                  super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.m_storage.m_rows,
                 (int)lambda_identity_local,local_50);
      pPVar7 = morphablemodel::MorphableModel::get_shape_model((MorphableModel *)landmarks_local);
      this_01 = (MatrixBase<Eigen::Matrix<float,_1,1,0,_1,1>> *)
                morphablemodel::PcaModel::get_mean(pPVar7);
      poVar8 = morphablemodel::MorphableModel::get_expression_model
                         ((MorphableModel *)landmarks_local);
      pvVar9 = std::
               optional<std::variant<eos::morphablemodel::PcaModel,_std::vector<eos::morphablemodel::Blendshape,_std::allocator<eos::morphablemodel::Blendshape>_>_>_>
               ::value(poVar8);
      std::vector<float,_std::allocator<float>_>::vector(&local_8d8,expression_coefficients);
      morphablemodel::draw_sample((morphablemodel *)&local_8c0,pvVar9,&local_8d8);
      Eigen::MatrixBase<Eigen::Matrix<float,-1,1,0,-1,1>>::operator+
                (&local_8b0,this_01,(MatrixBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_> *)&local_8c0
                );
      Eigen::Matrix<float,-1,1,0,-1,1>::
      Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<float,float>,Eigen::Matrix<float,_1,1,0,_1,1>const,Eigen::Matrix<float,_1,1,0,_1,1>const>>
                ((Matrix<float,_1,1,0,_1,1> *)local_898,
                 (EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<float,_float>,_const_Eigen::Matrix<float,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>_>
                  *)&local_8b0);
      Eigen::Matrix<float,_-1,_1,_0,_-1,_1>::~Matrix(&local_8c0);
      std::vector<float,_std::allocator<float>_>::~vector(&local_8d8);
      pPVar7 = morphablemodel::MorphableModel::get_shape_model((MorphableModel *)landmarks_local);
      Eigen::Matrix<float,_3,_4,_0,_3,_4>::Matrix
                (&local_928,(Matrix<float,_3,_4,_0,_3,_4> *)local_838);
      Eigen::Matrix<float,_-1,_1,_0,_-1,_1>::Matrix
                ((Matrix<float,__1,_1,_0,__1,_1> *)(local_960 + 0x28),
                 (Matrix<float,__1,_1,_0,__1,_1> *)local_898);
      local_960._32_8_ =
           num_expression_coefficients_to_fit_local.super__Optional_base<int,_true,_true>._M_payload
           .super__Optional_payload_base<int>;
      std::optional<float>::optional((optional<float> *)(local_960 + 0x18));
      std::optional<float>::optional((optional<float> *)(local_960 + 0x10));
      fit_shape_to_landmarks_linear
                (&local_8f0,pPVar7,&local_928,
                 (vector<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
                  *)&vertex_idx.super__Optional_base<int,_true,_true>._M_payload.
                     super__Optional_payload_base<int>._M_engaged,
                 (vector<int,_std::allocator<int>_> *)
                 &image_points.
                  super__Vector_base<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,(VectorXf *)(local_960 + 0x28),
                 lambda_identity,(optional<int>)local_960._32_8_,(optional<float>)local_960._24_8_,
                 (optional<float>)local_960._16_8_);
      std::vector<float,_std::allocator<float>_>::operator=(pca_shape_coefficients,&local_8f0);
      std::vector<float,_std::allocator<float>_>::~vector(&local_8f0);
      Eigen::Matrix<float,_-1,_1,_0,_-1,_1>::~Matrix
                ((Matrix<float,__1,_1,_0,__1,_1> *)(local_960 + 0x28));
      pPVar7 = morphablemodel::MorphableModel::get_shape_model((MorphableModel *)landmarks_local);
      std::vector<float,_std::allocator<float>_>::vector(&local_978,pca_shape_coefficients);
      morphablemodel::PcaModel::draw_sample
                ((PcaModel *)local_960,(vector<float,_std::allocator<float>_> *)pPVar7);
      Eigen::Matrix<float,_-1,_1,_0,_-1,_1>::operator=
                ((Matrix<float,__1,_1,_0,__1,_1> *)local_80,
                 (Matrix<float,__1,_1,_0,__1,_1> *)local_960);
      Eigen::Matrix<float,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<float,__1,_1,_0,__1,_1> *)local_960);
      std::vector<float,_std::allocator<float>_>::~vector(&local_978);
      poVar8 = morphablemodel::MorphableModel::get_expression_model
                         ((MorphableModel *)landmarks_local);
      pvVar9 = std::
               optional<std::variant<eos::morphablemodel::PcaModel,_std::vector<eos::morphablemodel::Blendshape,_std::allocator<eos::morphablemodel::Blendshape>_>_>_>
               ::value(poVar8);
      local_998 = morphable_model_local;
      local_9a0 = (_Optional_payload_base<float>)
                  lambda_expressions_local.super__Optional_base<float,_true,_true>._M_payload.
                  super__Optional_payload_base<float>;
      fit_expressions(&local_990,pvVar9,(VectorXf *)local_80,
                      (Matrix<float,_3,_4,_0,_3,_4> *)local_838,
                      (vector<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
                       *)&vertex_idx.super__Optional_base<int,_true,_true>._M_payload.
                          super__Optional_payload_base<int>._M_engaged,
                      (vector<int,_std::allocator<int>_> *)
                      &image_points.
                       super__Vector_base<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage,
                      (optional<float>)morphable_model_local,
                      (optional<int>)
                      lambda_expressions_local.super__Optional_base<float,_true,_true>._M_payload.
                      super__Optional_payload_base<float>);
      std::vector<float,_std::allocator<float>_>::operator=(expression_coefficients,&local_990);
      std::vector<float,_std::allocator<float>_>::~vector(&local_990);
      poVar8 = morphablemodel::MorphableModel::get_expression_model
                         ((MorphableModel *)landmarks_local);
      pvVar9 = std::
               optional<std::variant<eos::morphablemodel::PcaModel,_std::vector<eos::morphablemodel::Blendshape,_std::allocator<eos::morphablemodel::Blendshape>_>_>_>
               ::value(poVar8);
      std::vector<float,_std::allocator<float>_>::vector(&local_9e0,expression_coefficients);
      morphablemodel::draw_sample((morphablemodel *)&local_9c8,pvVar9,&local_9e0);
      Eigen::MatrixBase<Eigen::Matrix<float,-1,1,0,-1,1>>::operator+
                (&local_9b8,(MatrixBase<Eigen::Matrix<float,_1,1,0,_1,1>> *)local_80,
                 (MatrixBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_> *)&local_9c8);
      Eigen::Matrix<float,-1,1,0,-1,1>::operator=
                ((Matrix<float,_1,1,0,_1,1> *)local_a8,
                 (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<float,_float>,_const_Eigen::Matrix<float,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>_>
                  *)&local_9b8);
      Eigen::Matrix<float,_-1,_1,_0,_-1,_1>::~Matrix(&local_9c8);
      std::vector<float,_std::allocator<float>_>::~vector(&local_9e0);
      pPVar7 = morphablemodel::MorphableModel::get_color_model((MorphableModel *)landmarks_local);
      pVVar10 = morphablemodel::PcaModel::get_mean(pPVar7);
      pPVar7 = morphablemodel::MorphableModel::get_shape_model((MorphableModel *)landmarks_local);
      pvVar11 = morphablemodel::PcaModel::get_triangle_list(pPVar7);
      pPVar7 = morphablemodel::MorphableModel::get_color_model((MorphableModel *)landmarks_local);
      pvVar12 = morphablemodel::PcaModel::get_triangle_list(pPVar7);
      pvVar13 = morphablemodel::MorphableModel::get_texture_coordinates
                          ((MorphableModel *)landmarks_local);
      pvVar14 = morphablemodel::MorphableModel::get_texture_triangle_indices
                          ((MorphableModel *)landmarks_local);
      morphablemodel::sample_to_mesh
                (&local_a70,(VectorXf *)local_a8,pVVar10,pvVar11,pvVar12,pvVar13,pvVar14);
      core::Mesh::operator=
                ((Mesh *)&model_points.
                          super__Vector_base<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_std::allocator<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_a70);
      core::Mesh::~Mesh(&local_a70);
      Eigen::Matrix<float,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<float,__1,_1,_0,__1,_1> *)local_898);
      std::
      pair<std::vector<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>,_std::vector<int,_std::allocator<int>_>_>
      ::~pair((pair<std::vector<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>,_std::vector<int,_std::allocator<int>_>_>
               *)local_6b8);
      std::
      vector<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
      ::~vector((vector<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
                 *)&contour_landmarks_.
                    super__Vector_base<eos::core::Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>,_std::allocator<eos::core::Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
      std::vector<int,_std::allocator<int>_>::~vector
                ((vector<int,_std::allocator<int>_> *)(local_4d8 + 0x10));
      std::
      vector<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
      ::~vector((vector<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
                 *)&vertex_indices_contour.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage);
    }
    std::
    vector<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
    ::operator=(fitted_image_points,
                (vector<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
                 *)&vertex_idx.super__Optional_base<int,_true,_true>._M_payload.
                    super__Optional_payload_base<int>._M_engaged);
    std::pair<eos::core::Mesh,_eos::fitting::RenderingParameters>::
    pair<eos::core::Mesh_&,_eos::fitting::RenderingParameters_&,_true>
              (__return_storage_ptr__,
               (Mesh *)&model_points.
                        super__Vector_base<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_std::allocator<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage,
               (RenderingParameters *)local_2b8);
    std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_490);
    std::
    vector<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
    ::~vector((vector<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
               *)&fixed_vertex_indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
    std::
    vector<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
    ::~vector((vector<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
               *)&vertex_idx.super__Optional_base<int,_true,_true>._M_payload.
                  super__Optional_payload_base<int>._M_engaged);
    std::vector<int,_std::allocator<int>_>::~vector
              ((vector<int,_std::allocator<int>_> *)
               &image_points.
                super__Vector_base<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::
    vector<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_std::allocator<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>
    ::~vector((vector<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_std::allocator<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>
               *)&vertex_indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
    core::Mesh::~Mesh((Mesh *)&model_points.
                               super__Vector_base<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_std::allocator<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage);
    Eigen::Matrix<float,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<float,__1,_1,_0,__1,_1> *)local_a8);
    Eigen::Matrix<float,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<float,__1,_1,_0,__1,_1> *)local_80);
    return __return_storage_ptr__;
  }
  __assert_fail("pca_shape_coefficients.size() <= morphable_model.get_shape_model().get_num_principal_components()"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/patrikhuber[P]eos/include/eos/fitting/fitting.hpp"
                ,0x107,
                "std::pair<core::Mesh, fitting::RenderingParameters> eos::fitting::fit_shape_and_pose(const morphablemodel::MorphableModel &, const core::LandmarkCollection<Eigen::Vector2f> &, const core::LandmarkMapper &, int, int, const morphablemodel::EdgeTopology &, const fitting::ContourLandmarks &, const fitting::ModelContour &, int, cpp17::optional<int>, float, cpp17::optional<int>, cpp17::optional<float>, std::vector<float> &, std::vector<float> &, std::vector<Eigen::Vector2f> &)"
               );
}

Assistant:

inline std::pair<core::Mesh, fitting::RenderingParameters> fit_shape_and_pose(
    const morphablemodel::MorphableModel& morphable_model,
    const core::LandmarkCollection<Eigen::Vector2f>& landmarks, const core::LandmarkMapper& landmark_mapper,
    int image_width, int image_height, const morphablemodel::EdgeTopology& edge_topology,
    const fitting::ContourLandmarks& contour_landmarks, const fitting::ModelContour& model_contour,
    int num_iterations, cpp17::optional<int> num_shape_coefficients_to_fit, float lambda_identity,
    cpp17::optional<int> num_expression_coefficients_to_fit, cpp17::optional<float> lambda_expressions,
    std::vector<float>& pca_shape_coefficients, std::vector<float>& expression_coefficients,
    std::vector<Eigen::Vector2f>& fitted_image_points)
{
    // assert(blendshapes.size() > 0);
    assert(landmarks.size() >= 4);
    assert(image_width > 0 && image_height > 0);
    assert(num_iterations > 0); // Can we allow 0, for only the initial pose-fit?
    assert(pca_shape_coefficients.size() <= morphable_model.get_shape_model().get_num_principal_components());
    // More asserts I forgot?
    if (num_shape_coefficients_to_fit)
    {
        if (num_shape_coefficients_to_fit.value() >
            morphable_model.get_shape_model().get_num_principal_components())
        {
            throw std::runtime_error(
                "Specified more shape coefficients to fit than the given shape model contains.");
        }
    }

    using Eigen::MatrixXf;
    using Eigen::Vector2f;
    using Eigen::Vector4f;
    using Eigen::VectorXf;
    using std::vector;

    if (!num_shape_coefficients_to_fit)
    {
        num_shape_coefficients_to_fit = morphable_model.get_shape_model().get_num_principal_components();
    }

    if (pca_shape_coefficients.empty())
    {
        pca_shape_coefficients.resize(num_shape_coefficients_to_fit.value());
    }
    // Todo: This leaves the following case open: num_coeffs given is empty or defined, but the
    // pca_shape_coefficients given is != num_coeffs or the model's max-coeffs. What to do then? Handle & document!

    /*if (expression_coefficients.empty())
    {
        expression_coefficients.resize(blendshapes.size());
    }*/

    // Current mesh - either from the given coefficients, or the mean:
    VectorXf current_pca_shape = morphable_model.get_shape_model().draw_sample(pca_shape_coefficients);
    assert(morphable_model.has_separate_expression_model()); // Note: We could also just skip the expression fitting in this case.
    // Note we don't check whether the shape and expression model dimensions match.
    // Note: We're calling this in a loop, and morphablemodel::to_matrix(expression_blendshapes) now gets
    // called again in every fitting iteration.
    VectorXf current_combined_shape =
        current_pca_shape +
        draw_sample(morphable_model.get_expression_model().value(), expression_coefficients);
    auto current_mesh = morphablemodel::sample_to_mesh(
        current_combined_shape, morphable_model.get_color_model().get_mean(),
        morphable_model.get_shape_model().get_triangle_list(),
        morphable_model.get_color_model().get_triangle_list(), morphable_model.get_texture_coordinates(),
        morphable_model.get_texture_triangle_indices());

    // The 2D and 3D point correspondences used for the fitting:
    vector<Vector4f> model_points; // the points in the 3D shape model
    vector<int> vertex_indices; // their vertex indices
    vector<Vector2f> image_points; // the corresponding 2D landmark points

    // Sub-select all the landmarks which we have a mapping for (i.e. that are defined in the 3DMM),
    // and get the corresponding model points (mean if given no initial coeffs, from the computed shape otherwise):
    for (int i = 0; i < landmarks.size(); ++i)
    {
        const cpp17::optional<int> vertex_idx = core::get_vertex_index(
            landmarks[i].name, landmark_mapper, morphable_model.get_landmark_definitions());
        if (!vertex_idx) // vertex index not defined for the current landmark
        {
            continue;
        }
        model_points.emplace_back(current_mesh.vertices[vertex_idx.value()].homogeneous());
        vertex_indices.emplace_back(vertex_idx.value());
        image_points.emplace_back(landmarks[i].coordinates);
    }

    // Need to do an initial pose fit to do the contour fitting inside the loop.
    // We'll do an expression fit too, since face shapes vary quite a lot, depending on expressions.
    fitting::ScaledOrthoProjectionParameters current_pose =
        fitting::estimate_orthographic_projection_linear(image_points, model_points, true, image_height);
    fitting::RenderingParameters rendering_params(current_pose, image_width, image_height);

    const Eigen::Matrix<float, 3, 4> affine_from_ortho =
        fitting::get_3x4_affine_camera_matrix(rendering_params, image_width, image_height);
    expression_coefficients =
        fit_expressions(morphable_model.get_expression_model().value(), current_pca_shape, affine_from_ortho,
                        image_points, vertex_indices, lambda_expressions, num_expression_coefficients_to_fit);

    // Mesh with same PCA coeffs as before, but new expression fit (this is relevant if no initial blendshape coeffs have been given):
    current_combined_shape = current_pca_shape + draw_sample(morphable_model.get_expression_model().value(),
                                                             expression_coefficients);
    current_mesh = morphablemodel::sample_to_mesh(
        current_combined_shape, morphable_model.get_color_model().get_mean(),
        morphable_model.get_shape_model().get_triangle_list(),
        morphable_model.get_color_model().get_triangle_list(), morphable_model.get_texture_coordinates(),
        morphable_model.get_texture_triangle_indices());

    // The static (fixed) landmark correspondences which will stay the same throughout
    // the fitting (the inner face landmarks):
    const auto fixed_image_points = image_points;
    const auto fixed_vertex_indices = vertex_indices;

    for (int i = 0; i < num_iterations; ++i)
    {
        image_points = fixed_image_points;
        vertex_indices = fixed_vertex_indices;
        // Given the current pose, find 2D-3D contour correspondences of the front-facing face contour:
        vector<Vector2f> image_points_contour;
        vector<int> vertex_indices_contour;
        const auto yaw_angle = rendering_params.get_yaw_pitch_roll()[0];
        // For each 2D contour landmark, get the corresponding 3D vertex point and vertex id:
        std::tie(image_points_contour, std::ignore, vertex_indices_contour) =
            fitting::get_contour_correspondences(landmarks, contour_landmarks, model_contour, yaw_angle,
                                                 current_mesh, rendering_params.get_modelview(),
                                                 rendering_params.get_projection(),
                                                 fitting::get_opencv_viewport(image_width, image_height));
        // Add the contour correspondences to the set of landmarks that we use for the fitting:
        vertex_indices = fitting::concat(vertex_indices, vertex_indices_contour);
        image_points = fitting::concat(image_points, image_points_contour);

        // Fit the occluding (away-facing) contour using the detected contour LMs:
        vector<Vector2f> occluding_contour_landmarks;
        if (yaw_angle >= 0.0f) // positive yaw = subject looking to the left
        { // the left contour is the occluding one we want to use ("away-facing")
            const auto contour_landmarks_ =
                core::filter(landmarks, contour_landmarks.left_contour); // Can do this outside of the loop
            std::for_each(begin(contour_landmarks_), end(contour_landmarks_),
                          [&occluding_contour_landmarks](const auto& lm) {
                              occluding_contour_landmarks.push_back({lm.coordinates[0], lm.coordinates[1]});
                          });
        } else
        {
            const auto contour_landmarks_ = core::filter(landmarks, contour_landmarks.right_contour);
            std::for_each(begin(contour_landmarks_), end(contour_landmarks_),
                          [&occluding_contour_landmarks](const auto& lm) {
                              occluding_contour_landmarks.push_back({lm.coordinates[0], lm.coordinates[1]});
                          });
        }
        const auto edge_correspondences = fitting::find_occluding_edge_correspondences(
            current_mesh, edge_topology, rendering_params, occluding_contour_landmarks, 180.0f);
        image_points = fitting::concat(image_points, edge_correspondences.first);
        vertex_indices = fitting::concat(vertex_indices, edge_correspondences.second);

        // Get the model points of the current mesh, for all correspondences that we've got:
        model_points.clear();
        for (auto v : vertex_indices)
        {
            model_points.push_back({current_mesh.vertices[v][0], current_mesh.vertices[v][1],
                                    current_mesh.vertices[v][2], 1.0f});
        }

        // Re-estimate the pose, using all correspondences:
        current_pose =
            fitting::estimate_orthographic_projection_linear(image_points, model_points, true, image_height);
        rendering_params = fitting::RenderingParameters(current_pose, image_width, image_height);

        const Eigen::Matrix<float, 3, 4> affine_from_ortho =
            fitting::get_3x4_affine_camera_matrix(rendering_params, image_width, image_height);

        // Estimate the PCA shape coefficients with the current blendshape coefficients:
        const VectorXf mean_plus_expressions =
            morphable_model.get_shape_model().get_mean() +
            draw_sample(morphable_model.get_expression_model().value(), expression_coefficients);
        pca_shape_coefficients = fitting::fit_shape_to_landmarks_linear(
            morphable_model.get_shape_model(), affine_from_ortho, image_points, vertex_indices,
            mean_plus_expressions, lambda_identity, num_shape_coefficients_to_fit);

        // Estimate the blendshape coefficients with the current PCA model estimate:
        current_pca_shape = morphable_model.get_shape_model().draw_sample(pca_shape_coefficients);
        expression_coefficients = fit_expressions(
            morphable_model.get_expression_model().value(), current_pca_shape, affine_from_ortho,
            image_points, vertex_indices, lambda_expressions, num_expression_coefficients_to_fit);

        current_combined_shape =
            current_pca_shape +
            draw_sample(morphable_model.get_expression_model().value(), expression_coefficients);
        current_mesh = morphablemodel::sample_to_mesh(
            current_combined_shape, morphable_model.get_color_model().get_mean(),
            morphable_model.get_shape_model().get_triangle_list(),
            morphable_model.get_color_model().get_triangle_list(), morphable_model.get_texture_coordinates(),
            morphable_model.get_texture_triangle_indices());
    }

    fitted_image_points = image_points;
    return {current_mesh, rendering_params}; // I think we could also work with a VectorXf face_instance in
                                             // this function instead of a Mesh, but it would convolute the
                                             // code more (i.e. more complicated to access vertices).
}